

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

string * __thiscall
rcg::Device::getAccessStatus_abi_cxx11_(string *__return_storage_ptr__,Device *this)

{
  PIFGetDeviceInfo p_Var1;
  GC_ERROR GVar2;
  void *pvVar3;
  int32_t status;
  INFO_DATATYPE type;
  size_t size;
  __shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock(&this->mtx);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  type = 0;
  status = -1;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  size = 4;
  if (this->dev == (DEV_HANDLE)0x0) {
    pvVar3 = Interface::getHandle
                       ((this->parent).
                        super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (pvVar3 == (void *)0x0) {
      GVar2 = -0x3e9;
    }
    else {
      p_Var1 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               IFGetDeviceInfo;
      std::__shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 &(this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>);
      pvVar3 = Interface::getHandle(local_40._M_ptr);
      GVar2 = (*p_Var1)(pvVar3,(this->id)._M_dataplus._M_p,5,&type,&status,&size);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
  }
  else {
    GVar2 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DevGetInfo)(this->dev,5,&type,&status,&size);
  }
  if ((GVar2 == 0) && (type == 5)) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::string Device::getAccessStatus()
{
  std::lock_guard<std::mutex> lock(mtx);
  std::string ret;

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  int32_t status=-1;
  size_t size=sizeof(status);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (dev != 0)
  {
    err=gentl->DevGetInfo(dev, GenTL::DEVICE_INFO_ACCESS_STATUS, &type, &status, &size);
  }
  else if (parent->getHandle() != 0)
  {
    err=gentl->IFGetDeviceInfo(getParent()->getHandle(), id.c_str(),
                               GenTL::DEVICE_INFO_ACCESS_STATUS, &type, &status, &size);
  }

  if (err == GenTL::GC_ERR_SUCCESS)
  {
    if (type == GenTL::INFO_DATATYPE_INT32)
    {
      switch (status)
      {
        case GenTL::DEVICE_ACCESS_STATUS_READWRITE:
          ret="ReadWrite";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_READONLY:
          ret="ReadOnly";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_NOACCESS:
          ret="NoAccess";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_BUSY:
          ret="Busy";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_OPEN_READWRITE:
          ret="OpenReadWrite";
          break;

        case GenTL::DEVICE_ACCESS_STATUS_OPEN_READONLY:
          ret="OpenReadWrite";
          break;

        default:
          ret="Unknown";
          break;
      }
    }
  }

  return ret;
}